

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Bac_ManWriteBlifLines(FILE *pFile,Bac_Ntk_t *p)

{
  Abc_Nam_t *p_00;
  int iVar1;
  Bac_ObjType_t Type;
  Bac_Ntk_t *p_01;
  char *pcVar2;
  Mio_Library_t *pLib_00;
  Mio_Gate_t *pGate_00;
  char *pcVar3;
  bool bVar4;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib;
  char *pGateName;
  int local_20;
  int iTerm;
  int k;
  int i;
  Bac_Ntk_t *p_local;
  FILE *pFile_local;
  
  for (iTerm = 0; iVar1 = Bac_NtkObjNum(p), iTerm < iVar1; iTerm = iTerm + 1) {
    iVar1 = Bac_ObjIsBox(p,iTerm);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjIsBoxUser(p,iTerm);
      if (iVar1 == 0) {
        iVar1 = Bac_ObjIsGate(p,iTerm);
        pGateName._4_4_ = iTerm;
        if (iVar1 == 0) {
          fprintf((FILE *)pFile,".names");
          while( true ) {
            pGateName._4_4_ = pGateName._4_4_ + -1;
            bVar4 = false;
            if (-1 < pGateName._4_4_) {
              iVar1 = Bac_ObjIsBi(p,pGateName._4_4_);
              bVar4 = iVar1 != 0;
            }
            iVar1 = iTerm;
            if (!bVar4) break;
            iVar1 = Bac_ObjFanin(p,pGateName._4_4_);
            pcVar2 = Bac_ObjNameStr(p,iVar1);
            fprintf((FILE *)pFile," %s",pcVar2);
          }
          while( true ) {
            pGateName._4_4_ = iVar1 + 1;
            iVar1 = Bac_NtkObjNum(p);
            bVar4 = false;
            if (pGateName._4_4_ < iVar1) {
              iVar1 = Bac_ObjIsBo(p,pGateName._4_4_);
              bVar4 = iVar1 != 0;
            }
            if (!bVar4) break;
            pcVar2 = Bac_ObjNameStr(p,pGateName._4_4_);
            fprintf((FILE *)pFile," %s",pcVar2);
            iVar1 = pGateName._4_4_;
          }
          Type = Bac_ObjType(p,iTerm);
          pcVar2 = Ptr_TypeToSop(Type);
          fprintf((FILE *)pFile,"\n%s",pcVar2);
        }
        else {
          p_00 = p->pDesign->pMods;
          iVar1 = Bac_BoxNtkId(p,iTerm);
          pcVar2 = Abc_NamStr(p_00,iVar1);
          pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate_00 = Mio_LibraryReadGateByName(pLib_00,pcVar2,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar2);
          local_20 = 0;
          while( true ) {
            pGateName._4_4_ = pGateName._4_4_ + -1;
            bVar4 = false;
            if (-1 < pGateName._4_4_) {
              iVar1 = Bac_ObjIsBi(p,pGateName._4_4_);
              bVar4 = iVar1 != 0;
            }
            iVar1 = iTerm;
            if (!bVar4) break;
            pcVar2 = Mio_GateReadPinName(pGate_00,local_20);
            pcVar3 = Bac_ObjNameStr(p,pGateName._4_4_);
            fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
            local_20 = local_20 + 1;
          }
          while( true ) {
            pGateName._4_4_ = iVar1 + 1;
            iVar1 = Bac_NtkObjNum(p);
            bVar4 = false;
            if (pGateName._4_4_ < iVar1) {
              iVar1 = Bac_ObjIsBo(p,pGateName._4_4_);
              bVar4 = iVar1 != 0;
            }
            if (!bVar4) break;
            pcVar2 = Mio_GateReadOutName(pGate_00);
            pcVar3 = Bac_ObjNameStr(p,pGateName._4_4_);
            fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
            iVar1 = pGateName._4_4_;
          }
          fprintf((FILE *)pFile,"\n");
        }
      }
      else {
        fprintf((FILE *)pFile,".subckt");
        p_01 = Bac_BoxNtk(p,iTerm);
        pcVar2 = Bac_NtkName(p_01);
        fprintf((FILE *)pFile," %s",pcVar2);
        Bac_ManWriteBlifArray2(pFile,p,iTerm);
      }
    }
  }
  return;
}

Assistant:

void Bac_ManWriteBlifLines( FILE * pFile, Bac_Ntk_t * p )
{
    int i, k, iTerm;
    Bac_NtkForEachBox( p, i )
    {
        if ( Bac_ObjIsBoxUser(p, i) )
        {
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Bac_NtkName(Bac_BoxNtk(p, i)) );
            Bac_ManWriteBlifArray2( pFile, p, i );
        }
        else if ( Bac_ObjIsGate(p, i) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Bac_BoxNtkId(p, i));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Bac_ObjNameStr(p, iTerm) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, Bac_ObjFanin(p, iTerm)) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n%s",  Ptr_TypeToSop(Bac_ObjType(p, i)) );
        }
    }
}